

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_range.cpp
# Opt level: O2

char32_t dpfb::cp_range::parseCp(char **str)

{
  char cVar1;
  char32_t cVar2;
  int iVar3;
  CpRangeError *this;
  char *pcVar4;
  char *local_40;
  string local_38;
  
  cVar2 = unicode::strToCp(*str,&local_40);
  pcVar4 = *str;
  if (local_40 != pcVar4) {
    *str = local_40;
    return cVar2;
  }
  do {
    cVar1 = *pcVar4;
    local_40 = pcVar4;
    if ((cVar1 == '\0') || (cVar1 == ',')) break;
    iVar3 = isspace((int)cVar1);
    pcVar4 = pcVar4 + 1;
  } while (iVar3 == 0);
  this = (CpRangeError *)__cxa_allocate_exception(0x10);
  dpfb::str::format_abi_cxx11_
            (&local_38,"Invalid code point specifier \"%.*s\"",
             (ulong)(uint)((int)local_40 - (int)*str));
  CpRangeError::runtime_error(this,&local_38);
  __cxa_throw(this,&CpRangeError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static char32_t parseCp(const char*& str)
{
    const char* end;
    const auto result = unicode::strToCp(str, &end);
    if (end == str) {
        // Find a meaningful end of the invalid code point.
        end = str;
        while (const auto c = *end) {
            if (c == cpRangeSeparator || std::isspace(c))
                break;
            ++end;
        }

        throw CpRangeError(
            str::format(
                "Invalid code point specifier \"%.*s\"",
                static_cast<int>(end - str), str));
    }

    str = end;

    return result;
}